

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Base.cpp
# Opt level: O2

double __thiscall
chrono::ChFunction::Compute_min
          (ChFunction *this,double xmin,double xmax,double sampling_step,int derivate)

{
  double dVar1;
  double local_30;
  
  local_30 = 1e+30;
  for (; xmin <= xmax; xmin = xmin + sampling_step) {
    dVar1 = xmin;
    (*this->_vptr_ChFunction[10])(this,derivate);
    if (dVar1 < local_30) {
      local_30 = xmin;
      (*this->_vptr_ChFunction[10])(this,derivate);
    }
  }
  return local_30;
}

Assistant:

double ChFunction::Compute_min(double xmin, double xmax, double sampling_step, int derivate) const {
    double mret = +1E30;
    for (double mx = xmin; mx <= xmax; mx += sampling_step) {
        if (this->Get_y_dN(mx, derivate) < mret)
            mret = this->Get_y_dN(mx, derivate);
    }
    return mret;
}